

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O2

int find_label(disctx *ctx,section *sect,int ofs,int start_at)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (sect->first_label != -1) {
    iVar2 = sect->first_label;
    if (-1 < start_at) {
      iVar2 = start_at;
    }
    lVar1 = (long)iVar2;
    lVar3 = lVar1 * 0x18 + 0x10;
    for (; lVar1 <= sect->last_label; lVar1 = lVar1 + 1) {
      if ((*(int *)((long)&ctx->labels->name + lVar3) == 0) &&
         (*(long *)((long)ctx->labels + lVar3 + -8) == (long)ofs)) {
        return (int)lVar1;
      }
      lVar3 = lVar3 + 0x18;
    }
  }
  return -1;
}

Assistant:

int find_label(struct disctx *ctx, struct section *sect, int ofs, int start_at) {
	int i;
	/* Doesn't have any labels */
	if (sect->first_label == -1)
		return -1;
	for (i = start_at >= 0 ? start_at : sect->first_label; i <= sect->last_label; i++) {
		if (ctx->labels[i].type == 0 && ctx->labels[i].val == ofs)
			return i;
	}
	return -1;
}